

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<Qt::GestureType,_int>_>::Data
          (Data<QHashPrivate::Node<Qt::GestureType,_int>_> *this,
          Data<QHashPrivate::Node<Qt::GestureType,_int>_> *other,size_t reserved)

{
  Node<Qt::GestureType,_int> *key;
  ulong uVar1;
  Span *pSVar2;
  Node<Qt::GestureType,_int> *pNVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  size_t numBuckets;
  R RVar8;
  Bucket BVar9;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  uVar1 = other->size;
  this->size = uVar1;
  if (reserved < uVar1) {
    reserved = uVar1;
  }
  this->seed = other->seed;
  this->spans = (Span *)0x0;
  numBuckets = 0x80;
  if ((0x40 < reserved) && (numBuckets = 0xffffffffffffffff, reserved >> 0x3e == 0)) {
    lVar4 = 0x3f;
    if (reserved != 0) {
      for (; reserved >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    numBuckets = 1L << (0x41 - ((byte)lVar4 ^ 0x3f) & 0x3f);
  }
  this->numBuckets = numBuckets;
  RVar8 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar8.spans;
  uVar1 = other->numBuckets;
  if (0x7f < uVar1) {
    lVar4 = 0;
    uVar6 = 0;
    do {
      pSVar2 = other->spans;
      lVar7 = 0;
      do {
        uVar5 = (ulong)pSVar2->offsets[lVar7 + lVar4];
        if (uVar5 != 0xff) {
          key = (Node<Qt::GestureType,_int> *)(pSVar2[uVar6].entries + uVar5);
          uVar5 = (this->seed >> 0x20 ^ this->seed ^ (ulong)key->key) * -0x2917014799a6026d;
          uVar5 = (uVar5 >> 0x20 ^ uVar5) * -0x2917014799a6026d;
          BVar9 = findBucketWithHash<Qt::GestureType>(this,(GestureType *)key,uVar5 >> 0x20 ^ uVar5)
          ;
          pNVar3 = Span<QHashPrivate::Node<Qt::GestureType,_int>_>::insert(BVar9.span,BVar9.index);
          *pNVar3 = *key;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x80);
      uVar6 = uVar6 + 1;
      lVar4 = lVar4 + 0x90;
    } while (uVar6 != uVar1 >> 7);
  }
  return;
}

Assistant:

Data(const Data &other, size_t reserved) : size(other.size), seed(other.seed)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(qMax(size, reserved));
        spans = allocateSpans(numBuckets).spans;
        size_t otherNSpans = other.numBuckets >> SpanConstants::SpanShift;
        reallocationHelper<true>(other, otherNSpans);
    }